

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

int ExecuteShellCommand(CStringRef command,bool throw_on_nonzero_exit_code)

{
  char *__command;
  undefined8 uVar1;
  undefined1 in_SIL;
  BasicCStringRef<char> in_RDI;
  CStringRef unaff_retaddr;
  int exit_code;
  int result;
  BasicCStringRef<char> local_40;
  int local_34;
  BasicCStringRef<char> local_30 [3];
  BasicCStringRef<char> local_18;
  uint local_10;
  undefined3 in_stack_fffffffffffffff4;
  uint c;
  
  c = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  __command = fmt::BasicCStringRef<char>::c_str((BasicCStringRef<char> *)&stack0xfffffffffffffff8);
  local_10 = system(__command);
  if (local_10 == 0xffffffff) {
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"system failed, error code = {}");
    __errno_location();
    mp::Error::Error((Error *)in_RDI.data_,unaff_retaddr,c);
    __cxa_throw(uVar1,&mp::Error::typeinfo,mp::Error::~Error);
  }
  if ((local_10 & 0x7f) != 0) {
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (local_30,"process hasn\'t exited normally, error code = {}");
    mp::Error::Error((Error *)in_RDI.data_,unaff_retaddr,c);
    __cxa_throw(uVar1,&mp::Error::typeinfo,mp::Error::~Error);
  }
  local_34 = (int)(local_10 & 0xff00) >> 8;
  if ((local_34 != 0) && ((c & 0x1000000) != 0)) {
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_40,"process exited with code {}");
    mp::Error::Error((Error *)in_RDI.data_,unaff_retaddr,c);
    __cxa_throw(uVar1,&mp::Error::typeinfo,mp::Error::~Error);
  }
  return local_34;
}

Assistant:

int ExecuteShellCommand(
    fmt::CStringRef command, bool throw_on_nonzero_exit_code) {
#ifdef _WIN32
  std::wstring command_str = fmt::internal::UTF8ToUTF16(command.c_str()).str();
  std::replace(command_str.begin(), command_str.end(), L'/', L'\\');
  int result = _wsystem(command_str.c_str());
#else
  int result = std::system(command.c_str());
#endif
  // Check if system function failed.
  if (result == -1)
    throw mp::Error("system failed, error code = {}", errno);
  // Check if process hasn't exited normally.
  if (!WIFEXITED(result)) {
    throw mp::Error(
        "process hasn't exited normally, error code = {}", result);
  }
  // Process exited normally - check exit code.
  int exit_code = WEXITSTATUS(result);
  if (exit_code != 0 && throw_on_nonzero_exit_code)
    throw mp::Error("process exited with code {}", exit_code);
  return exit_code;
}